

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int handle_reset_stream_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  anon_struct_112_3_9a32880d_for_ingress *paVar1;
  uint8_t *end;
  int iVar2;
  int iVar3;
  uint64_t stream_id;
  uint64_t uVar4;
  uint uVar5;
  bool bVar6;
  uint64_t bytes_missing;
  quicly_stream_t *stream;
  uint64_t local_40;
  quicly_stream_t *local_38;
  
  end = state->end;
  stream_id = ptls_decode_quicint(&state->src,end);
  iVar2 = 0x20007;
  uVar5 = 0x30000;
  if (stream_id == 0xffffffffffffffff) {
    bVar6 = false;
  }
  else {
    uVar4 = ptls_decode_quicint(&state->src,end);
    bVar6 = false;
    if (uVar4 != 0xffffffffffffffff) {
      state = (st_quicly_handle_payload_state_t *)ptls_decode_quicint(&state->src,end);
      uVar5 = (uint)uVar4 & 0xffff | 0x30000;
      bVar6 = true;
      iVar2 = 0;
    }
  }
  if ((bVar6) &&
     (iVar2 = quicly_get_or_open_stream(conn,stream_id,&local_38),
     local_38 != (quicly_stream_t *)0x0 && iVar2 == 0)) {
    if ((local_38->recvstate).received.num_ranges != 0) {
      iVar2 = quicly_recvstate_reset(&local_38->recvstate,(uint64_t)state,&local_40);
      if (iVar2 == 0) {
        paVar1 = &local_38->conn->ingress;
        (paVar1->max_data).bytes_consumed = (paVar1->max_data).bytes_consumed + local_40;
        (*local_38->callbacks->on_receive_reset)(local_38,uVar5);
        iVar2 = 0xff06;
        bVar6 = (local_38->conn->super).state < QUICLY_STATE_CLOSING;
        if (bVar6) {
          iVar3 = stream_is_destroyable(local_38);
          bVar6 = true;
          if (iVar3 != 0) {
            destroy_stream(local_38,0);
          }
        }
      }
      else {
        bVar6 = false;
      }
      if (!bVar6) {
        return iVar2;
      }
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int handle_reset_stream_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    quicly_reset_stream_frame_t frame;
    quicly_stream_t *stream;
    int ret;

    if ((ret = quicly_decode_reset_stream_frame(&state->src, state->end, &frame)) != 0)
        return ret;

    if ((ret = quicly_get_or_open_stream(conn, frame.stream_id, &stream)) != 0 || stream == NULL)
        return ret;

    if (!quicly_recvstate_transfer_complete(&stream->recvstate)) {
        uint64_t bytes_missing;
        if ((ret = quicly_recvstate_reset(&stream->recvstate, frame.final_size, &bytes_missing)) != 0)
            return ret;
        stream->conn->ingress.max_data.bytes_consumed += bytes_missing;
        int err = QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(frame.app_error_code);
        QUICLY_PROBE(STREAM_ON_RECEIVE_RESET, stream->conn, stream->conn->stash.now, stream, err);
        stream->callbacks->on_receive_reset(stream, err);
        if (stream->conn->super.state >= QUICLY_STATE_CLOSING)
            return QUICLY_ERROR_IS_CLOSING;
        if (stream_is_destroyable(stream))
            destroy_stream(stream, 0);
    }

    return 0;
}